

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cte_node.cpp
# Opt level: O3

string * __thiscall
duckdb::CTENode::ToString_abi_cxx11_(string *__return_storage_ptr__,CTENode *this)

{
  pointer pQVar1;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pQVar1 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator->
                     (&this->child);
  (*pQVar1->_vptr_QueryNode[3])(local_38,pQVar1);
  ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_38[0]);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

string CTENode::ToString() const {
	string result;
	result += child->ToString();
	return result;
}